

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::ConvertWeights
          (FBXConverter *this,aiMesh *out,Model *model,MeshGeometry *geo,
          aiMatrix4x4 *node_global_transform,uint materialIndex,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *outputVertStartIndices)

{
  pointer ppCVar1;
  Cluster *cl;
  uint *puVar2;
  uint *puVar3;
  aiBone *paVar4;
  pointer ppaVar5;
  uint *puVar6;
  uint uVar7;
  Skin *pSVar8;
  MatIndexArray *pMVar9;
  uint *puVar10;
  aiBone **__s;
  uint *puVar11;
  Model *extraout_RDX;
  Model *extraout_RDX_00;
  Model *extraout_RDX_01;
  ulong uVar12;
  Model *extraout_RDX_02;
  Model *extraout_RDX_03;
  Model *pMVar13;
  ulong uVar14;
  uint *puVar15;
  pointer ppCVar16;
  MeshGeometry *this_00;
  ulong uVar17;
  pointer ppaVar18;
  uint count;
  unsigned_long local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> index_out_indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> out_indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> count_out_indices;
  size_t no_index_sentinel;
  vector<aiBone_*,_std::allocator<aiBone_*>_> bones;
  
  pSVar8 = Geometry::DeformerSkin(&geo->super_Geometry);
  if (pSVar8 == (Skin *)0x0) {
    __assert_fail("geo.DeformerSkin()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                  ,0x5b1,
                  "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, unsigned int, std::vector<unsigned int> *)"
                 );
  }
  out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar8 = Geometry::DeformerSkin(&geo->super_Geometry);
  bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<aiBone_*,_std::allocator<aiBone_*>_>::reserve
            (&bones,(long)(pSVar8->clusters).
                          super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pSVar8->clusters).
                          super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  if (outputVertStartIndices == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0 &&
      materialIndex != 0xffffffff) {
    __assert_fail("no_mat_check || outputVertStartIndices",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                  ,0x5bd,
                  "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, unsigned int, std::vector<unsigned int> *)"
                 );
  }
  ppCVar16 = (pSVar8->clusters).
             super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (pSVar8->clusters).
            super__Vector_base<const_Assimp::FBX::Cluster_*,_std::allocator<const_Assimp::FBX::Cluster_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppaVar18 = bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppaVar5 = bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while( true ) {
    bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
    _M_start = ppaVar18;
    bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = ppaVar5;
    if (ppCVar16 == ppCVar1) {
      if (ppaVar18 != ppaVar5) {
        uVar14 = (long)ppaVar5 - (long)ppaVar18 >> 3;
        uVar12 = -(ulong)(uVar14 >> 0x3d != 0) | (long)ppaVar5 - (long)ppaVar18;
        __s = (aiBone **)operator_new__(uVar12);
        memset(__s,0,uVar12);
        out->mBones = __s;
        out->mNumBones = (uint)uVar14;
        do {
          paVar4 = *ppaVar18;
          *ppaVar18 = *__s;
          *__s = paVar4;
          ppaVar18 = ppaVar18 + 1;
          __s = __s + 1;
        } while (ppaVar18 != ppaVar5);
      }
      if (bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(count_out_indices.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)count_out_indices.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)count_out_indices.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(index_out_indices.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)index_out_indices.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)index_out_indices.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(out_indices.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)out_indices.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)out_indices.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    cl = *ppCVar16;
    if (cl == (Cluster *)0x0) break;
    this_00 = geo;
    pMVar9 = MeshGeometry::GetMaterialIndices(geo);
    no_index_sentinel = 0xffffffffffffffff;
    if (count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    if (index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    if (out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    puVar2 = (cl->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pMVar13 = extraout_RDX;
    for (puVar15 = (cl->indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start; puVar15 != puVar2;
        puVar15 = puVar15 + 1) {
      count = 0;
      puVar10 = MeshGeometry::ToOutputVertexIndex(geo,*puVar15,&count);
      if (puVar10 == (uint *)0x0) {
        __assert_fail("out_idx != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                      ,0x5d6,
                      "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, unsigned int, std::vector<unsigned int> *)"
                     );
      }
      if (index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&index_out_indices,
                   (iterator)
                   index_out_indices.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish,&no_index_sentinel);
      }
      else {
        *index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_finish = no_index_sentinel;
        index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_f0 = 0;
      this_00 = (MeshGeometry *)&count_out_indices;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,&local_f0);
      pMVar13 = extraout_RDX_00;
      if (count != 0) {
        uVar14 = 0;
        do {
          if ((materialIndex == 0xffffffff) ||
             (this_00 = geo, uVar7 = MeshGeometry::FaceForVertexIndex(geo,puVar10[uVar14]),
             pMVar13 = extraout_RDX_01,
             (long)(pMVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar7] == (ulong)materialIndex)) {
            if (index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1] == 0xffffffffffffffff) {
              index_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1] =
                   (long)out_indices.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)out_indices.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
            }
            if (materialIndex == 0xffffffff) {
              local_f0 = (unsigned_long)puVar10[uVar14];
              this_00 = (MeshGeometry *)&out_indices;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              emplace_back<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,&local_f0)
              ;
              pMVar13 = extraout_RDX_03;
            }
            else {
              puVar3 = (outputVertStartIndices->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              uVar12 = (long)(outputVertStartIndices->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
              puVar11 = puVar3;
              if (0 < (long)uVar12) {
                do {
                  uVar17 = uVar12 >> 1;
                  uVar12 = ~uVar17 + uVar12;
                  puVar6 = puVar11 + uVar17 + 1;
                  if (puVar10[uVar14] <= puVar11[uVar17]) {
                    uVar12 = uVar17;
                    puVar6 = puVar11;
                  }
                  puVar11 = puVar6;
                } while (0 < (long)uVar12);
              }
              local_f0 = (long)puVar11 - (long)puVar3 >> 2;
              this_00 = (MeshGeometry *)&out_indices;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              emplace_back<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,&local_f0)
              ;
              pMVar13 = extraout_RDX_02;
            }
            count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish[-1] =
                 count_out_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1] + 1;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < count);
      }
    }
    ConvertCluster((FBXConverter *)this_00,&bones,pMVar13,cl,&out_indices,&index_out_indices,
                   &count_out_indices,node_global_transform);
    ppCVar16 = ppCVar16 + 1;
    ppaVar18 = bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppaVar5 = bones.super__Vector_base<aiBone_*,_std::allocator<aiBone_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  __assert_fail("cluster",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                ,0x5c2,
                "void Assimp::FBX::FBXConverter::ConvertWeights(aiMesh *, const Model &, const MeshGeometry &, const aiMatrix4x4 &, unsigned int, std::vector<unsigned int> *)"
               );
}

Assistant:

void FBXConverter::ConvertWeights(aiMesh* out, const Model& model, const MeshGeometry& geo,
            const aiMatrix4x4& node_global_transform,
            unsigned int materialIndex,
            std::vector<unsigned int>* outputVertStartIndices)
        {
            ai_assert(geo.DeformerSkin());

            std::vector<size_t> out_indices;
            std::vector<size_t> index_out_indices;
            std::vector<size_t> count_out_indices;

            const Skin& sk = *geo.DeformerSkin();

            std::vector<aiBone*> bones;
            bones.reserve(sk.Clusters().size());

            const bool no_mat_check = materialIndex == NO_MATERIAL_SEPARATION;
            ai_assert(no_mat_check || outputVertStartIndices);

            try {

                for (const Cluster* cluster : sk.Clusters()) {
                    ai_assert(cluster);

                    const WeightIndexArray& indices = cluster->GetIndices();

                    const MatIndexArray& mats = geo.GetMaterialIndices();

                    const size_t no_index_sentinel = std::numeric_limits<size_t>::max();

                    count_out_indices.clear();
                    index_out_indices.clear();
                    out_indices.clear();

                    // now check if *any* of these weights is contained in the output mesh,
                    // taking notes so we don't need to do it twice.
                    for (WeightIndexArray::value_type index : indices) {

                        unsigned int count = 0;
                        const unsigned int* const out_idx = geo.ToOutputVertexIndex(index, count);
                        // ToOutputVertexIndex only returns NULL if index is out of bounds
                        // which should never happen
                        ai_assert(out_idx != NULL);

                        index_out_indices.push_back(no_index_sentinel);
                        count_out_indices.push_back(0);

                        for (unsigned int i = 0; i < count; ++i) {
                            if (no_mat_check || static_cast<size_t>(mats[geo.FaceForVertexIndex(out_idx[i])]) == materialIndex) {

                                if (index_out_indices.back() == no_index_sentinel) {
                                    index_out_indices.back() = out_indices.size();
                                }

                                if (no_mat_check) {
                                    out_indices.push_back(out_idx[i]);
                                } else {
                                    // this extra lookup is in O(logn), so the entire algorithm becomes O(nlogn)
                                    const std::vector<unsigned int>::iterator it = std::lower_bound(
                                        outputVertStartIndices->begin(),
                                        outputVertStartIndices->end(),
                                        out_idx[i]
                                    );

                                    out_indices.push_back(std::distance(outputVertStartIndices->begin(), it));
                                }

                                ++count_out_indices.back();                               
                            }
                        }
                    }
                    
                    // if we found at least one, generate the output bones
                    // XXX this could be heavily simplified by collecting the bone
                    // data in a single step.
                    ConvertCluster(bones, model, *cluster, out_indices, index_out_indices,
                            count_out_indices, node_global_transform);
                }
            }
            catch (std::exception&) {
                std::for_each(bones.begin(), bones.end(), Util::delete_fun<aiBone>());
                throw;
            }

            if (bones.empty()) {
                return;
            }

            out->mBones = new aiBone*[bones.size()]();
            out->mNumBones = static_cast<unsigned int>(bones.size());

            std::swap_ranges(bones.begin(), bones.end(), out->mBones);
        }